

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool CheckTag(HSQUIRRELVM v,SQWRITEFUNC read,SQUserPointer up,SQUnsignedInteger32 tag)

{
  bool bVar1;
  SQUnsignedInteger32 local_30;
  SQUnsignedInteger32 local_2c;
  SQUnsignedInteger32 t;
  SQUnsignedInteger32 tag_local;
  SQUserPointer up_local;
  SQWRITEFUNC read_local;
  HSQUIRRELVM v_local;
  
  local_2c = tag;
  _t = up;
  up_local = read;
  read_local = (SQWRITEFUNC)v;
  bVar1 = SafeRead(v,read,up,&local_30,4);
  if (bVar1) {
    if (local_30 == local_2c) {
      v_local._7_1_ = true;
    }
    else {
      SQVM::Raise_Error((SQVM *)read_local,"invalid or corrupted closure stream");
      v_local._7_1_ = false;
    }
  }
  else {
    v_local._7_1_ = false;
  }
  return v_local._7_1_;
}

Assistant:

bool CheckTag(HSQUIRRELVM v,SQWRITEFUNC read,SQUserPointer up,SQUnsignedInteger32 tag)
{
    SQUnsignedInteger32 t;
    _CHECK_IO(SafeRead(v,read,up,&t,sizeof(t)));
    if(t != tag){
        v->Raise_Error(_SC("invalid or corrupted closure stream"));
        return false;
    }
    return true;
}